

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O1

void __thiscall
iutest::AssertionHelper::OnFixed(AssertionHelper *this,Fixed *fixed,bool isException)

{
  int iVar1;
  code *pcVar2;
  ScopedTrace *this_00;
  Variable *pVVar3;
  TestFlag *pTVar4;
  string append_message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::stringbuf::str();
  if (local_38._M_string_length != 0) {
    std::operator+(&local_58," ",&local_38);
    std::__cxx11::string::_M_append((char *)this,(ulong)local_58._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  this_00 = ScopedTrace::GetInstance();
  ScopedTrace::append_message(this_00,&this->m_part_result,isException);
  pVVar3 = TestEnv::get_vars();
  if (pVVar3->m_testpartresult_reporter == (TestPartResultReporterInterface *)0x0) {
    detail::DefaultGlobalTestPartResultReporter::DefaultReportTestPartResult(&this->m_part_result);
  }
  else {
    pVVar3 = TestEnv::get_vars();
    (*pVVar3->m_testpartresult_reporter->_vptr_TestPartResultReporterInterface[2])
              (pVVar3->m_testpartresult_reporter,this);
  }
  iVar1 = *(int *)&(this->m_part_result).super_iuCodeMessage.field_0x2c;
  pTVar4 = TestFlag::GetInstance();
  if ((0 < iVar1) || ((iVar1 == -1 & (byte)pTVar4->m_test_flags >> 7) != 0)) {
    pTVar4 = TestFlag::GetInstance();
    if ((pTVar4->m_test_flags & 0x10) != 0) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void OnFixed(const Fixed& fixed, bool isException = false)
    {
        // OnFixed で throw しないこと！テスト側の例外キャッチにかからなくなる
        const ::std::string append_message = fixed.GetString();
        if( !append_message.empty() )
        {
            m_part_result.add_message(" " + append_message);
        }
        ScopedTrace::GetInstance().append_message(m_part_result, isException);

        if( TestEnv::GetGlobalTestPartResultReporter() != IUTEST_NULLPTR )
        {
            TestEnv::GetGlobalTestPartResultReporter()->ReportTestPartResult(m_part_result);
        }
        else
        {
            detail::DefaultReportTestPartResult(m_part_result);
        }

        if IUTEST_COND_UNLIKELY(m_part_result.failed()
            && TestFlag::IsEnableFlag(iutest::TestFlag::BREAK_ON_FAILURE))
        {
            IUTEST_BREAK();
        }